

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O3

int uudecode_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  short sVar1;
  int iVar2;
  ssize_t sVar3;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ssize_t avail;
  size_t nbytes_read;
  ssize_t nl;
  ssize_t ravail;
  byte *local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_58 = (byte *)__archive_read_filter_ahead(filter,1,(ssize_t *)&local_50);
  if (local_58 == (byte *)0x0) {
    return 0;
  }
  local_38 = local_50;
  local_48 = local_50;
  uVar11 = 0x14;
  do {
    sVar3 = bid_get_line(filter,&local_58,(ssize_t *)&local_50,(ssize_t *)&local_38,&local_40,
                         &local_48);
    if (sVar3 < 0) {
      return 0;
    }
    if (local_40 == 0) {
      return 0;
    }
    if (10 < sVar3 - local_40) {
      iVar2 = *(int *)local_58;
      sVar1 = *(short *)(local_58 + 4);
      if (sVar1 == 0x206e && iVar2 == 0x69676562) {
        lVar8 = 6;
      }
      else {
        if (((ulong)(sVar3 - local_40) < 0x12) ||
           (*(long *)(local_58 + 5) != 0x203436657361622d || *(long *)local_58 != 0x61622d6e69676562
           )) goto LAB_0011f04a;
        lVar8 = 0xd;
      }
      if ((((0xf7 < (byte)(local_58[lVar8] - 0x38)) && (0xf7 < (byte)(local_58[lVar8 + 1] - 0x38)))
          && (0xf7 < (byte)(local_58[lVar8 + 2] - 0x38))) && (local_58[lVar8 + 3] == 0x20)) {
        local_58 = local_58 + sVar3;
        local_50 = local_50 - sVar3;
        if (local_50 == 0) {
          return 0;
        }
        uVar6 = (uint)lVar8;
        uVar4 = bid_get_line(filter,&local_58,(ssize_t *)&local_50,(ssize_t *)&local_38,&local_40,
                             &local_48);
        if (local_40 == 0 || (long)uVar4 < 0) {
          return 0;
        }
        lVar8 = local_50 - uVar4;
        uVar7 = uVar4;
        if (sVar1 != 0x206e || iVar2 != 0x69676562) goto LAB_0011f0e3;
        if (""[*local_58] == '\0') {
          return 0;
        }
        uVar10 = *local_58 & 0x3f;
        uVar6 = uVar10 ^ 0x20;
        if (0x2d < (byte)uVar6) {
          return 0;
        }
        local_58 = local_58 + 1;
        uVar7 = uVar4 - 1;
        lVar9 = uVar7 - local_40;
        if ((char)uVar10 == ' ') goto LAB_0011f267;
        break;
      }
    }
LAB_0011f04a:
    local_58 = local_58 + sVar3;
    local_50 = local_50 - sVar3;
    uVar11 = 0;
    if (0x1ffff < local_48) {
      return 0;
    }
  } while( true );
  do {
    if (lVar9 < 1) break;
    if (""[*local_58] == '\0') {
      return 0;
    }
    if (""[local_58[1]] == '\0') {
      return 0;
    }
    if ((int)uVar6 < 2) {
      local_58 = local_58 + 2;
      lVar9 = -2;
LAB_0011f25c:
      uVar7 = uVar7 + lVar9;
      lVar9 = uVar7 - local_40;
      uVar6 = 0;
      break;
    }
    if (""[local_58[2]] == '\0') {
      return 0;
    }
    if (uVar6 == 2) {
      lVar9 = -3;
      local_58 = local_58 + 3;
      goto LAB_0011f25c;
    }
    if (""[local_58[3]] == '\0') {
      return 0;
    }
    local_58 = local_58 + 4;
    uVar7 = uVar7 - 4;
    lVar9 = uVar7 - local_40;
    uVar6 = uVar6 - 3;
  } while (uVar6 != 0);
LAB_0011f267:
  if (-1 < lVar9) {
    if ((lVar9 == 1) && (""[*local_58] != '\0' || (byte)(*local_58 + 0x9f) < 0x1a)) {
      local_58 = local_58 + 1;
      uVar7 = uVar7 - 1;
    }
    local_58 = local_58 + local_40;
    if ((local_50 != uVar4) && (""[*local_58] != '\0')) {
      return uVar11 + 0x1e;
    }
LAB_0011f0e3:
    if (uVar6 == 0xd) {
      pbVar5 = local_58;
      if (uVar7 - local_40 != 0 && local_40 <= (long)uVar7) {
        pbVar5 = local_58 + (uVar7 - local_40);
        do {
          if (""[*local_58] == '\0') {
            return 0;
          }
          local_58 = local_58 + 1;
          uVar7 = uVar7 - 1;
        } while (local_40 < (long)uVar7);
      }
      if (lVar8 < 5) {
        if (lVar8 < 1) {
          return 0;
        }
      }
      else if ((pbVar5[local_40 + 4] == 10 && *(int *)(pbVar5 + local_40) == 0x3d3d3d3d) ||
              ((lVar8 != 5 &&
               (*(short *)(pbVar5 + local_40 + 4) == 0xa0d &&
                *(int *)(pbVar5 + local_40) == 0x3d3d3d3d)))) {
        return uVar11 | 0x28;
      }
      if (""[pbVar5[local_40]] != '\0') {
        return uVar11 + 0x1e;
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

static int
uudecode_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *b;
	ssize_t avail, ravail;
	ssize_t len, nl;
	int l;
	int firstline;
	size_t nbytes_read;

	(void)self; /* UNUSED */

	b = __archive_read_filter_ahead(filter, 1, &avail);
	if (b == NULL)
		return (0);

	firstline = 20;
	ravail = avail;
	nbytes_read = avail;
	for (;;) {
		len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
		if (len < 0 || nl == 0)
			return (0); /* No match found. */
		if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
			l = 6;
		else if (len -nl >= 18 && memcmp(b, "begin-base64 ", 13) == 0)
			l = 13;
		else
			l = 0;

		if (l > 0 && (b[l] < '0' || b[l] > '7' ||
		    b[l+1] < '0' || b[l+1] > '7' ||
		    b[l+2] < '0' || b[l+2] > '7' || b[l+3] != ' '))
			l = 0;

		b += len;
		avail -= len;
		if (l)
			break;
		firstline = 0;

		/* Do not read more than UUENCODE_BID_MAX_READ bytes */
		if (nbytes_read >= UUENCODE_BID_MAX_READ)
			return (0);
	}
	if (!avail)
		return (0);
	len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
	if (len < 0 || nl == 0)
		return (0);/* There are non-ascii characters. */
	avail -= len;

	if (l == 6) {
		if (!uuchar[*b])
			return (0);
		/* Get a length of decoded bytes. */
		l = UUDECODE(*b++); len--;
		if (l > 45)
			/* Normally, maximum length is 45(character 'M'). */
			return (0);
		while (l && len-nl > 0) {
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				if (!uuchar[*b++])
					return (0);
				len -= 2;
				--l;
			}
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				--len;
				--l;
			}
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				--len;
				--l;
			}
		}
		if (len-nl < 0)
			return (0);
		if (len-nl == 1 &&
		    (uuchar[*b] ||		 /* Check sum. */
		     (*b >= 'a' && *b <= 'z'))) {/* Padding data(MINIX). */
			++b;
			--len;
		}
		b += nl;
		if (avail && uuchar[*b])
			return (firstline+30);
	}
	if (l == 13) {
		while (len-nl > 0) {
			if (!base64[*b++])
				return (0);
			--len;
		}
		b += nl;

		if (avail >= 5 && memcmp(b, "====\n", 5) == 0)
			return (firstline+40);
		if (avail >= 6 && memcmp(b, "====\r\n", 6) == 0)
			return (firstline+40);
		if (avail > 0 && base64[*b])
			return (firstline+30);
	}

	return (0);
}